

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsimplex_p.cpp
# Opt level: O2

void __thiscall QSimplexConstraint::invert(QSimplexConstraint *this)

{
  byte bVar1;
  Span *pSVar2;
  Entry *pEVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  piter local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  this->constant = -this->constant;
  this->ratio = MoreOrEqual - this->ratio;
  local_20 = (piter)QHash<QSimplexVariable_*,_double>::begin(&this->variables);
  while( true ) {
    if (local_20.d == (Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> *)0x0 &&
        local_20.bucket == 0) break;
    pSVar2 = (local_20.d)->spans;
    uVar4 = local_20.bucket >> 7;
    pEVar3 = pSVar2[uVar4].entries;
    bVar1 = pSVar2[uVar4].offsets[(uint)local_20.bucket & 0x7f];
    *(ulong *)(pEVar3[bVar1].storage.data + 8) =
         *(ulong *)(pEVar3[bVar1].storage.data + 8) ^ 0x8000000000000000;
    QHashPrivate::iterator<QHashPrivate::Node<QSimplexVariable_*,_double>_>::operator++(&local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSimplexConstraint::invert()
{
    constant = -constant;
    ratio = Ratio(2 - ratio);

    for (auto iter = variables.begin(); iter != variables.end(); ++iter)
        iter.value() = -iter.value();
}